

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O2

put_transaction<std::complex<double>_> * __thiscall
density::
conc_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_ostream,density::f_istream,density::f_rtti>,density::basic_default_allocator<65536ul>>
::start_emplace<std::complex<double>,std::complex<double>>
          (put_transaction<std::complex<double>_> *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_ostream,density::f_istream,density::f_rtti>,density::basic_default_allocator<65536ul>>
          *this,complex<double> *i_construction_params)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_70;
  put_transaction<std::complex<double>_> local_60;
  put_transaction<std::complex<double>_> local_48;
  
  std::unique_lock<std::mutex>::unique_lock(&local_70,(mutex_type *)this);
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_ostream,density::f_istream,density::f_rtti>,density::basic_default_allocator<65536ul>>
  ::start_emplace<std::complex<double>,std::complex<double>>
            (&local_60,
             (heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_ostream,density::f_istream,density::f_rtti>,density::basic_default_allocator<65536ul>>
              *)(this + 0x28),i_construction_params);
  conc_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_ostream,_density::f_istream,_density::f_rtti>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<std::complex<double>_>::put_transaction(&local_48,0,&local_70,&local_60);
  (__return_storage_ptr__->m_lock)._M_device = local_48.m_lock._M_device;
  (__return_storage_ptr__->m_lock)._M_owns = local_48.m_lock._M_owns;
  local_48.m_lock._M_device = (mutex_type *)0x0;
  local_48.m_lock._M_owns = false;
  (__return_storage_ptr__->m_put_transaction).m_queue = local_48.m_put_transaction.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_48.m_put_transaction.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_48.m_put_transaction.m_put_data.m_user_storage;
  local_48.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_ostream,_density::f_istream,_density::f_rtti>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  conc_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_ostream,_density::f_istream,_density::f_rtti>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<std::complex<double>_>::~put_transaction(&local_48);
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_ostream,_density::f_istream,_density::f_rtti>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<std::complex<double>_>::~put_transaction(&local_60);
  std::unique_lock<std::mutex>::~unique_lock(&local_70);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::unique_lock<std::mutex> lock(m_mutex);
            return put_transaction<ELEMENT_TYPE>(
              PrivateType(),
              std::move(lock),
              m_queue.template start_emplace<ELEMENT_TYPE>(
                std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...));
        }